

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::SetItem
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,uint32 index,Var value,PropertyOperationFlags flags)

{
  byte bVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext_00;
  ScriptContext *scriptContext;
  bool throwIfNotExtensible;
  bool isExtensible;
  PropertyOperationFlags flags_local;
  Var value_local;
  uint32 index_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_local;
  
  bVar1 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  if (((bVar1 & 1) == 0) && (bVar2 = DynamicObject::HasObjectArray(instance), !bVar2)) {
    if ((flags & (PropertyOperation_ThrowIfNotExtensible|PropertyOperation_StrictMode)) ==
        PropertyOperation_None) {
      return 0;
    }
    scriptContext_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec4a,(PCWSTR)0x0);
  }
  BVar3 = DynamicObject::SetObjectArrayItem(instance,index,value,flags);
  return BVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItem(DynamicObject* instance, uint32 index, Var value, PropertyOperationFlags flags)
    {
        if (IsNotExtensibleSupported)
        {
            // When adding a new property && we are not extensible:
            // - if (!objectArray) => do not even get into creating new objectArray
            //   (anyhow, if we were to create one, we would need one supporting non-extensible, i.e. ES5Array).
            // - else the array was created earlier and will handle the operation
            //   (it would be non-extensible ES5 array as array must match object's IsExtensible).
            bool isExtensible = (this->GetFlags() & IsExtensibleFlag) != 0;
            if (!isExtensible && !instance->HasObjectArray())   // Note: Setitem && !HasObjectArray => attempt to add a new item.
            {
                bool throwIfNotExtensible = (flags & (PropertyOperation_StrictMode | PropertyOperation_ThrowIfNotExtensible)) != 0;
                if (throwIfNotExtensible)
                {
                    ScriptContext* scriptContext = instance->GetScriptContext();
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NonExtensibleObject);
                }
                return FALSE;
            }
        }

        return instance->SetObjectArrayItem(index, value, flags);   // I.e. __super::SetItem(...).
    }